

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html_tree_renderer.cpp
# Opt level: O0

void __thiscall
duckdb::HTMLTreeRenderer::Render(HTMLTreeRenderer *this,PhysicalOperator *op,ostream *ss)

{
  type root;
  PhysicalOperator *in_RDI;
  unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> tree;
  ostream *ss_00;
  TreeRenderer *in_stack_ffffffffffffffd0;
  ostream local_20 [32];
  
  ss_00 = local_20;
  RenderTree::CreateRenderTree(in_RDI);
  root = unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>::operator*
                   ((unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> *
                    )ss_00);
  TreeRenderer::ToStream(in_stack_ffffffffffffffd0,root,ss_00);
  unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>::~unique_ptr
            ((unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> *)
             0x1583ad0);
  return;
}

Assistant:

void HTMLTreeRenderer::Render(const PhysicalOperator &op, std::ostream &ss) {
	auto tree = RenderTree::CreateRenderTree(op);
	ToStream(*tree, ss);
}